

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.cpp
# Opt level: O1

void __thiscall AGSSock::Pool::add(Pool *this,Socket *sock)

{
  int __sig;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<AGSSock::Socket_*,_true,_false>,_bool> pVar1;
  __node_gen_type __node_gen;
  Socket *local_28;
  Pool *local_20;
  
  __sig = (int)&local_28;
  local_28 = sock;
  pthread_mutex_lock((pthread_mutex_t *)&this->guard_);
  local_20 = this;
  pVar1 = std::
          _Hashtable<AGSSock::Socket*,AGSSock::Socket*,std::allocator<AGSSock::Socket*>,std::__detail::_Identity,std::equal_to<AGSSock::Socket*>,std::hash<AGSSock::Socket*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<AGSSock::Socket*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<AGSSock::Socket*,false>>>>
                    ((_Hashtable<AGSSock::Socket*,AGSSock::Socket*,std::allocator<AGSSock::Socket*>,std::__detail::_Identity,std::equal_to<AGSSock::Socket*>,std::hash<AGSSock::Socket*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)this);
  if ((((undefined1  [16])pVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
     ((this->sockets_)._M_h._M_element_count != 1)) {
    AGSSockAPI::Beacon::signal(&this->beacon_,__sig,pVar1._8_8_);
  }
  else {
    AGSSockAPI::Thread::start(&this->thread_);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->guard_);
  return;
}

Assistant:

void Pool::add(Socket *sock)
{
	Mutex::Lock lock(guard_);

	if (sockets_.insert(sock).second && sockets_.size() == 1)
		thread_.start();
	else
		beacon_.signal();
}